

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

void cppcms::xss::anon_unknown_8::split_to_parts
               (char *begin,char *end,
               vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
               *tags)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  pointer peVar4;
  pointer peVar5;
  pointer ppVar6;
  undefined8 uVar7;
  html_data_type hVar8;
  char *tmp;
  char *pcVar9;
  pointer peVar10;
  char *pcVar11;
  long lVar12;
  pointer peVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  uint uVar17;
  _Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  *this;
  value_type local_88;
  pointer local_40;
  long local_38;
  
  this = (_Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
          *)0x0;
  pcVar9 = begin;
  if (begin != end) {
    do {
      uVar17 = (int)this + (uint)(*pcVar9 == '<');
      this = (_Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              *)(ulong)uVar17;
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != end);
    this = (_Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            *)(ulong)uVar17;
  }
  peVar4 = (tags->
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           )._M_impl.super__Vector_impl_data._M_start;
  peVar5 = (tags->
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  peVar13 = peVar4;
  local_40 = (pointer)tags;
  if (peVar5 != peVar4) {
    do {
      ppVar6 = (peVar13->tag).properties.
               super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ppVar6 != (pointer)0x0) {
        operator_delete(ppVar6);
      }
      peVar13 = peVar13 + 1;
    } while (peVar13 != peVar5);
    (((_Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
       *)&local_40->begin)->_M_impl).super__Vector_impl_data._M_finish = peVar4;
    tags = (vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            *)local_40;
  }
  local_40 = (tags->
             super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((_Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
       *)(((long)(tags->
                 super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_40 >> 3) *
         -0x71c71c71c71c71c7) < this) {
    peVar4 = (tags->
             super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    peVar10 = std::
              _Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              ::_M_allocate(this,(size_t)local_40);
    peVar5 = (tags->
             super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             )._M_impl.super__Vector_impl_data._M_start;
    peVar13 = (tags->
              super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (peVar5 != peVar13) {
      lVar12 = 0;
      do {
        puVar1 = (undefined8 *)((long)&peVar5->begin + lVar12);
        *(undefined4 *)((long)&peVar10->type + lVar12) = *(undefined4 *)(puVar1 + 2);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)&peVar10->begin + lVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        uVar7 = puVar1[4];
        puVar2 = (undefined8 *)((long)&(peVar10->tag).tag_begin + lVar12);
        *puVar2 = puVar1[3];
        puVar2[1] = uVar7;
        *(undefined4 *)((long)&(peVar10->tag).pair + lVar12) = *(undefined4 *)(puVar1 + 5);
        uVar7 = puVar1[7];
        puVar2 = (undefined8 *)
                 ((long)&(peVar10->tag).properties.
                         super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12);
        *puVar2 = puVar1[6];
        puVar2[1] = uVar7;
        *(undefined8 *)
         ((long)&(peVar10->tag).properties.
                 super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar12) = puVar1[8];
        puVar1[6] = 0;
        puVar1[7] = 0;
        puVar1[8] = 0;
        lVar12 = lVar12 + 0x48;
      } while ((pointer)(puVar1 + 9) != peVar13);
    }
    lVar12 = (long)peVar4 - (long)local_40;
    peVar4 = (tags->
             super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (peVar4 != (pointer)0x0) {
      operator_delete(peVar4);
    }
    (tags->
    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    )._M_impl.super__Vector_impl_data._M_start = peVar10;
    (tags->
    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar12 + (long)peVar10);
    (tags->
    super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = peVar10 + (long)this;
  }
  if (begin != end) {
    local_40 = (pointer)(end + -1);
    local_38 = 5 - (long)end;
    do {
      bVar3 = *begin;
      local_88.begin = begin;
      if (bVar3 == 0x3e) {
        pbVar14 = (byte *)begin + 1;
        local_88.type = invalid_data;
        local_88.tag.tag_begin = (char *)0x0;
        local_88.tag.tag_end = (char *)0x0;
        local_88.tag.pair = -1;
        local_88.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.tag.properties.
        super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_88.end = (char *)pbVar14;
        std::
        vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
        ::push_back(tags,&local_88);
        begin = (char *)pbVar14;
        if (local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.tag.properties.
                          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        local_88.end = end;
        if (bVar3 == 0x3c) {
          pbVar14 = (byte *)begin + 4;
          if ((((pbVar14 < end) && (((byte *)begin)[1] == 0x21)) && (((byte *)begin)[2] == 0x2d)) &&
             (((byte *)begin)[3] == 0x2d)) {
            pcVar9 = (char *)0x4;
            if (pbVar14 < local_40) {
              pcVar11 = (char *)0x4;
              do {
                if ((((byte *)begin)[(long)pcVar11] == 0x2d) &&
                   (pcVar9 = pcVar11, ((byte *)begin + 1)[(long)pcVar11] == 0x2d)) break;
                pbVar16 = (byte *)begin + local_38 + (long)pcVar11;
                pcVar11 = pcVar11 + 1;
                pcVar9 = end + ~(ulong)begin;
              } while (pbVar16 != (byte *)0x3);
            }
            if ((end <= pcVar9 + (long)begin + 2) || ((pcVar9 + (long)begin)[2] != '>')) {
              local_88.type = invalid_data;
              local_88.tag.tag_begin = (char *)0x0;
              local_88.tag.tag_end = (char *)0x0;
              local_88.tag.pair = -1;
              local_88.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_88.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_88.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              ::push_back(tags,&local_88);
LAB_0022141c:
              begin = end;
              if (local_88.tag.properties.
                  super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_88.tag.properties.
                                super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_0022147b;
            }
            local_88.type = html_comment;
            if (4 < (long)pcVar9) {
              local_88.type = html_comment;
              do {
                bVar3 = *pbVar14;
                if ((0x3e < (ulong)bVar3) ||
                   (hVar8 = invalid_data, (0x5000004000000000U >> ((ulong)bVar3 & 0x3f) & 1) == 0))
                {
                  hVar8 = local_88.type;
                }
                local_88.type = hVar8;
              } while (((0x3e < bVar3) ||
                       ((0x5000004000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) == 0)) &&
                      (pbVar14 = pbVar14 + 1, pbVar14 < pcVar9 + (long)begin));
            }
            pbVar14 = (byte *)(pcVar9 + (long)begin + 3);
            local_88.tag.tag_begin = (char *)0x0;
            local_88.tag.tag_end = (char *)0x0;
            local_88.tag.pair = -1;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_88.end = (char *)pbVar14;
            std::
            vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            ::push_back(tags,&local_88);
          }
          else {
            pbVar14 = (byte *)begin + 1;
            do {
              pbVar16 = pbVar14;
              if (pbVar16 == (byte *)end) goto LAB_002213e3;
              pbVar14 = pbVar16 + 1;
            } while (*pbVar16 != 0x3e);
            if (pbVar16 == (byte *)end) {
LAB_002213e3:
              local_88.type = invalid_data;
              local_88.tag.tag_begin = (char *)0x0;
              local_88.tag.tag_end = (char *)0x0;
              local_88.tag.pair = -1;
              local_88.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_88.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_88.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              ::push_back(tags,&local_88);
              goto LAB_0022141c;
            }
            local_88.type = html_tag;
            local_88.tag.tag_begin = (char *)0x0;
            local_88.tag.tag_end = (char *)0x0;
            local_88.tag.pair = -1;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_88.end = (char *)pbVar14;
            std::
            vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            ::push_back(tags,&local_88);
          }
        }
        else {
          pbVar16 = (byte *)begin + 1;
          pbVar14 = (byte *)begin + 1;
          if (bVar3 == 0x26) {
            do {
              pbVar16 = pbVar14;
              if (pbVar16 == (byte *)end) goto LAB_002213a8;
              pbVar14 = pbVar16 + 1;
            } while (*pbVar16 != 0x3b);
            if (pbVar16 == (byte *)end) {
LAB_002213a8:
              local_88.type = invalid_data;
              local_88.tag.tag_begin = (char *)0x0;
              local_88.tag.tag_end = (char *)0x0;
              local_88.tag.pair = -1;
              local_88.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_88.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_88.tag.properties.
              super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
              ::push_back(tags,&local_88);
              goto LAB_0022141c;
            }
            local_88.type = html_entity;
            local_88.tag.tag_begin = (char *)0x0;
            local_88.tag.tag_end = (char *)0x0;
            local_88.tag.pair = -1;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_88.end = (char *)pbVar14;
            std::
            vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            ::push_back(tags,&local_88);
          }
          else {
            do {
              pbVar15 = pbVar16;
              pbVar14 = (byte *)end;
              if (pbVar15 == (byte *)end) break;
              pbVar16 = pbVar15 + 1;
            } while ((0x3e < (ulong)*pbVar15) ||
                    (pbVar14 = pbVar15, (0x5000004000000000U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0))
            ;
            local_88.type = plain_text;
            local_88.tag.tag_begin = (char *)0x0;
            local_88.tag.tag_end = (char *)0x0;
            local_88.tag.pair = -1;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_88.end = (char *)pbVar14;
            std::
            vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
            ::push_back(tags,&local_88);
          }
        }
        begin = (char *)pbVar14;
        if (local_88.tag.properties.
            super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.tag.properties.
                          super__Vector_base<cppcms::xss::(anonymous_namespace)::property_data,_std::allocator<cppcms::xss::(anonymous_namespace)::property_data>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
LAB_0022147b:
    } while (begin != end);
  }
  return;
}

Assistant:

void split_to_parts(char const *begin,char const *end,std::vector<entry> &tags)
		{
			unsigned count = 0;

			for(char const *tmp = begin;tmp!=end;tmp++) {
				if(*tmp == '<')
					count++;
			}
			
			tags.clear();
			tags.reserve(count);

			char const *p=begin;

			while(p!=end) {
				char c=*p;
				switch(c) {
				case '&':
					{
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							if(*e==';')
								break;
						}

						if(e==end) {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}
						else {
							tags.push_back(entry(p,e+1,html_entity));
							p=e+1;
						}
					}
					break;

				case '<':

					if(p+4 < end && p[1]=='!' && p[2]=='-' && p[3]=='-') {
						char const *e =p + 4;
						while(e<end-1) {
							if(e[0]=='-' && e[1]=='-') 
								break;
							e++;
						}
						if(e+2<end && e[2]=='>') {
							
							html_data_type type = html_comment;
							
							for(char const *tmp = p+4;tmp<e;tmp++) {
								char c=*tmp;
								///
								/// Prevent IE conditionals
								///
								if(c=='>' || c=='<' || c=='&') {
									type = invalid_data;
									break;
								}
							}

							tags.push_back(entry(p,e+3,type));
							p=e+3;
						}
						else {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}

					}
					else {
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							if(*e=='>')
								break;
						}
						if(e==end) {
							tags.push_back(entry(p,end,invalid_data));
							p=end;
						}
						else {
							tags.push_back(entry(p,e+1,html_tag));
							p=e+1;
						}
					}

					break;

				case '>':
					{
						tags.push_back(entry(p,p+1,invalid_data));
						p++;
					}
					break;
				default:
					{
						char const *e=0;
						for(e=p+1;e!=end;e++) {
							char c=*e;
							if(c=='<' || c=='>' || c=='&')
								break;
						}
						tags.push_back(entry(p,e,plain_text));
						p=e;
					}
				} 
			} // while 
		}